

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O3

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicExpression<mp::QuadAndLinTerms>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *cc,
               ItemNamer *vnam)

{
  double dVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  size_t sVar5;
  ulong uVar6;
  char *str;
  ptrdiff_t _Num;
  FormatSpec local_48;
  
  pcVar4 = ItemNamer::at(vnam,(long)cc->compl_var_);
  __n = strlen(pcVar4);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  uVar6 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar6) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar6);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,pcVar4,__n);
  }
  pBVar2->size_ = uVar6;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar5 = pBVar2->size_;
  uVar6 = sVar5 + 0xd;
  if (pBVar2->capacity_ < uVar6) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar6);
    sVar5 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar5," complements ",0xd);
  pBVar2->size_ = uVar6;
  WriteModelItem(wrt,&(cc->compl_expr_).super_QuadAndLinTerms,vnam);
  dVar1 = (cc->compl_expr_).constant_term_;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar5 = pBVar2->size_;
  uVar6 = sVar5 + 3;
  if (pBVar2->capacity_ < uVar6) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar6);
    sVar5 = pBVar2->size_;
  }
  pcVar4 = " - ";
  if (0.0 <= dVar1) {
    pcVar4 = " + ";
  }
  pcVar3 = pBVar2->ptr_;
  pcVar3[sVar5 + 2] = pcVar4[2];
  *(undefined2 *)(pcVar3 + sVar5) = *(undefined2 *)pcVar4;
  pBVar2->size_ = uVar6;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>
            (&wrt->super_BasicWriter<char>,ABS((cc->compl_expr_).constant_term_),&local_48);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ComplementarityConstraint<Expr>& cc,
                    ItemNamer& vnam) {
  wrt << vnam.at(cc.GetVariable());
  wrt << " complements ";
  WriteModelItem(wrt, cc.GetExpression(), vnam);
}